

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.cpp
# Opt level: O2

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_15(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  char local_e5;
  ExpressionDecomposer local_e4;
  Result local_e0;
  pair<char,_double> p;
  pair<char,_double> *local_b0;
  Enum local_a8;
  ResultBuilder DOCTEST_RB;
  
  p.first = 'c';
  p.second = 3.14;
  doctest::String::String((String *)&local_e0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/tuple/get.cpp"
             ,0x3f,"burst::get<0>(p) == \'c\'","",(String *)&local_e0);
  doctest::String::~String((String *)&local_e0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_e4,DT_CHECK);
  local_b0 = &p;
  local_a8 = local_e4.m_at;
  local_e5 = 'c';
  doctest::detail::Expression_lhs<char_const&>::operator==
            (&local_e0,(Expression_lhs<char_const&> *)&local_b0,&local_e5);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
  doctest::String::~String(&local_e0.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  return;
}

Assistant:

movable (const movable &):
            initialized_by{initialization_way::copy}
        {
        }